

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coll.cpp
# Opt level: O0

UObject * __thiscall
icu_63::ICUCollatorFactory::create
          (ICUCollatorFactory *this,ICUServiceKey *key,ICUService *param_2,UErrorCode *status)

{
  int iVar1;
  undefined1 local_118 [8];
  Locale loc;
  LocaleKey *lkey;
  UErrorCode *status_local;
  ICUService *param_2_local;
  ICUServiceKey *key_local;
  ICUCollatorFactory *this_local;
  
  iVar1 = (*(this->super_ICUResourceBundleFactory).super_LocaleKeyFactory.super_ICUServiceFactory.
            super_UObject._vptr_UObject[6])(this,key,status);
  if ((char)iVar1 == '\0') {
    this_local = (ICUCollatorFactory *)0x0;
  }
  else {
    loc._216_8_ = key;
    Locale::Locale((Locale *)local_118);
    (**(code **)(*(long *)loc._216_8_ + 0x58))(loc._216_8_,(Locale *)local_118);
    this_local = (ICUCollatorFactory *)Collator::makeInstance((Locale *)local_118,status);
    Locale::~Locale((Locale *)local_118);
  }
  return (UObject *)this_local;
}

Assistant:

UObject*
ICUCollatorFactory::create(const ICUServiceKey& key, const ICUService* /* service */, UErrorCode& status) const {
    if (handlesKey(key, status)) {
        const LocaleKey& lkey = (const LocaleKey&)key;
        Locale loc;
        // make sure the requested locale is correct
        // default LocaleFactory uses currentLocale since that's the one vetted by handlesKey
        // but for ICU rb resources we use the actual one since it will fallback again
        lkey.canonicalLocale(loc);
        
        return Collator::makeInstance(loc, status);
    }
    return NULL;
}